

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

int vfio_setup_interrupt(int device_fd)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  char buf [512];
  int err;
  int64_t result;
  vfio_irq_info irq;
  int i;
  undefined1 local_238 [524];
  int local_2c;
  long local_28;
  undefined4 local_1c;
  uint local_18;
  int local_14;
  undefined4 local_10;
  int local_c;
  int local_8;
  
  local_8 = in_EDI;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  local_c = 2;
  while( true ) {
    if (local_c < 0) {
      return -1;
    }
    local_1c = 0x10;
    local_18 = 0;
    local_14 = local_c;
    local_10 = 0;
    iVar1 = ioctl(local_8,0x3b6d,&local_1c);
    local_28 = (long)iVar1;
    if (local_28 == -1) break;
    if ((local_18 & 1) != 0) {
      return local_c;
    }
    fprintf(_stderr,"[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xa0,"vfio_setup_interrupt");
    local_c = local_c + -1;
  }
  piVar2 = __errno_location();
  local_2c = *piVar2;
  __xpg_strerror_r(local_2c,local_238,0x200);
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x9c,
          "vfio_setup_interrupt","get IRQ Info",local_238);
  exit(local_2c);
}

Assistant:

int vfio_setup_interrupt(int device_fd) {
	info("Setup VFIO Interrupts");

	for (int i = VFIO_PCI_MSIX_IRQ_INDEX; i >= 0; i--) {
		struct vfio_irq_info irq = {.argsz = sizeof(irq), .index = i};

		check_err(ioctl(device_fd, VFIO_DEVICE_GET_IRQ_INFO, &irq), "get IRQ Info");

		/* if this vector cannot be used with eventfd continue with next*/
		if ((irq.flags & VFIO_IRQ_INFO_EVENTFD) == 0) {
			debug("IRQ doesn't support Event FD");
			continue;
		}

		return i;
	}

	return -1;
}